

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::TestSuite::test_to_run_count(TestSuite *this)

{
  int iVar1;
  TestSuite *this_local;
  
  iVar1 = internal::
          CountIf<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,bool(*)(testing::TestInfo_const*)>
                    (&this->test_info_list_,ShouldRunTest);
  return iVar1;
}

Assistant:

int TestSuite::test_to_run_count() const {
  return CountIf(test_info_list_, ShouldRunTest);
}